

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O1

ion_err_t ion_add_to_master_table
                    (ion_dictionary_t *dictionary,ion_dictionary_size_t dictionary_size)

{
  ion_dictionary_parent_t *piVar1;
  ion_err_t iVar2;
  ion_dictionary_config_info_t config;
  ion_dictionary_config_info_t local_20;
  
  piVar1 = dictionary->instance;
  local_20.id = piVar1->id;
  local_20.use_type = '\0';
  local_20.type = piVar1->key_type;
  local_20.key_size = (piVar1->record).key_size;
  local_20.value_size = (piVar1->record).value_size;
  local_20.dictionary_type = piVar1->type;
  local_20.dictionary_status = dictionary->status;
  local_20.dictionary_size = dictionary_size;
  iVar2 = ion_master_table_write(&local_20,-2);
  return iVar2;
}

Assistant:

ion_err_t
ion_add_to_master_table(
	ion_dictionary_t		*dictionary,
	ion_dictionary_size_t	dictionary_size
) {
	ion_dictionary_config_info_t config = {
		.id = dictionary->instance->id, .use_type = 0, .type = dictionary->instance->key_type, .key_size = dictionary->instance->record.key_size, .value_size = dictionary->instance->record.value_size, .dictionary_size = dictionary_size, .dictionary_type = dictionary->instance->type, .dictionary_status = dictionary->status
	};

	return ion_master_table_write(&config, ION_MASTER_TABLE_WRITE_FROM_END);
}